

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftpproto.c
# Opt level: O0

void do_site_chmod(session_t *sess,char *chmod_arg)

{
  uint __mode;
  int iVar1;
  size_t sVar2;
  char local_f8 [4];
  uint mode;
  char file [100];
  char local_88 [8];
  char perms [100];
  char *chmod_arg_local;
  session_t *sess_local;
  
  sVar2 = strlen(chmod_arg);
  if (sVar2 == 0) {
    ftp_relply(sess,500,"SITE CHMOD needs 2 arguments.");
  }
  else {
    memset(local_88,0,100);
    memset(local_f8,0,100);
    str_split(chmod_arg,local_88,local_f8,' ');
    sVar2 = strlen(local_f8);
    if (sVar2 == 0) {
      ftp_relply(sess,500,"SITE CHMOD needs 2 arguments.");
    }
    else {
      __mode = str_octal_to_uint(local_88);
      iVar1 = chmod(local_f8,__mode);
      if (iVar1 < 0) {
        ftp_relply(sess,0x1f8,"SITE CHMOD failed.");
      }
      else {
        ftp_relply(sess,200,"SITE CHMOD ok.");
      }
    }
  }
  return;
}

Assistant:

void do_site_chmod(session_t *sess, char *chmod_arg) {
  // chmod <param> <file>
  if (strlen(chmod_arg) == 0) {
    ftp_relply(sess, FTP_BADCMD, "SITE CHMOD needs 2 arguments.");
    return;
  }
  char perms[100] = {0};
  char file[100] = {0};

  str_split(chmod_arg, perms, file, ' ');
  if (strlen(file) == 0) {
    ftp_relply(sess, FTP_BADCMD, "SITE CHMOD needs 2 arguments.");
    return;
  }

  unsigned int mode = str_octal_to_uint(perms);
  if (chmod(file, mode) < 0) {
    ftp_relply(sess, FTP_BADMODE, "SITE CHMOD failed.");
  } else {
    ftp_relply(sess, FTP_CHMODOK, "SITE CHMOD ok.");
  }
}